

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ObjFaninLit0p(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int c;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjFaninId0p(p,pObj);
  c = Gia_ObjFaninC0(pObj);
  iVar1 = Abc_Var2Lit(iVar1,c);
  return iVar1;
}

Assistant:

static inline int          Gia_ObjFaninLit0p( Gia_Man_t * p, Gia_Obj_t * pObj) { return Abc_Var2Lit( Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );    }